

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O3

Pdr_Set_t * Pdr_ManReduceClause(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  size_t __size;
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Pdr_Set_t *pCube_00;
  ulong uVar7;
  uint nLits;
  
  if ((k < 0) || (p->vSolvers->nSize <= k)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar2 = p->vSolvers->pArray[(uint)k];
  pVVar5 = Pdr_ManLitsToCube(p,k,*(int **)((long)pvVar2 + 0x138),*(int *)((long)pvVar2 + 0x134));
  nLits = pVVar5->nSize;
  uVar3 = pCube->nLits;
  if (nLits == uVar3) {
    return (Pdr_Set_t *)0x0;
  }
  if ((int)uVar3 <= (int)nLits) {
    __assert_fail("Vec_IntSize(vLits) < pCube->nLits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                  ,0x5e,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  if ((int)nLits < 1) {
    uVar7 = 0;
LAB_005512a5:
    if ((uint)uVar7 != nLits) goto LAB_00551383;
  }
  else {
    uVar7 = 0;
    do {
      if ((*(byte *)(pVVar5->pArray + uVar7) & 1) == 0) goto LAB_005512a5;
      uVar7 = uVar7 + 1;
    } while (nLits != uVar7);
  }
  uVar7 = 0;
  if ((int)uVar3 < 1) {
LAB_00551376:
    if ((int)uVar7 < (int)uVar3) {
      nLits = pVVar5->nSize;
LAB_00551383:
      pCube_00 = Pdr_SetCreateSubset(pCube,pVVar5->pArray,nLits);
      iVar4 = Pdr_SetIsInit(pCube_00,-1);
      if (iVar4 == 0) {
        return pCube_00;
      }
      __assert_fail("!Pdr_SetIsInit(pCubeMin, -1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                    ,0x70,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
  }
  else {
    do {
      uVar1 = *(uint *)(&pCube->field_0x14 + uVar7 * 4);
      if ((uVar1 & 1) == 0) {
        if (nLits == pVVar5->nCap) {
          if ((int)nLits < 0x10) {
            if (pVVar5->pArray == (int *)0x0) {
              piVar6 = (int *)malloc(0x40);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pArray,0x40);
            }
            pVVar5->pArray = piVar6;
            if (piVar6 == (int *)0x0) {
LAB_0055140f:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar5->nCap = 0x10;
          }
          else {
            __size = (ulong)nLits * 8;
            if (pVVar5->pArray == (int *)0x0) {
              piVar6 = (int *)malloc(__size);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pArray,__size);
            }
            pVVar5->pArray = piVar6;
            if (piVar6 == (int *)0x0) goto LAB_0055140f;
            pVVar5->nCap = nLits * 2;
          }
        }
        else {
          piVar6 = pVVar5->pArray;
        }
        iVar4 = pVVar5->nSize;
        pVVar5->nSize = iVar4 + 1;
        piVar6[iVar4] = uVar1;
        uVar3 = pCube->nLits;
        goto LAB_00551376;
      }
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  __assert_fail("i < pCube->nLits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                ,0x6c,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
}

Assistant:

Pdr_Set_t * Pdr_ManReduceClause( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pCubeMin;
    Vec_Int_t * vLits;
    int i, Entry, nCoreLits, * pCoreLits;
    // get relevant SAT literals
    nCoreLits = sat_solver_final(Pdr_ManSolver(p, k), &pCoreLits);
    // translate them into register literals and remove auxiliary
    vLits = Pdr_ManLitsToCube( p, k, pCoreLits, nCoreLits );
    // skip if there is no improvement
    if ( Vec_IntSize(vLits) == pCube->nLits )
        return NULL;
    assert( Vec_IntSize(vLits) < pCube->nLits );
    // if the cube overlaps with init, add any literal
    Vec_IntForEachEntry( vLits, Entry, i )
        if ( lit_sign(Entry) == 0 ) // positive literal
            break;
    if ( i == Vec_IntSize(vLits) ) // only negative literals
    {
        // add the first positive literal
        for ( i = 0; i < pCube->nLits; i++ )
            if ( lit_sign(pCube->Lits[i]) == 0 ) // positive literal
            {
                Vec_IntPush( vLits, pCube->Lits[i] );
                break;
            }
        assert( i < pCube->nLits );
    }
    // generate a starting cube
    pCubeMin  = Pdr_SetCreateSubset( pCube, Vec_IntArray(vLits), Vec_IntSize(vLits) );
    assert( !Pdr_SetIsInit(pCubeMin, -1) );
/*
    // make sure the cube works
    {
    int RetValue;
    RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, 0 );
    assert( RetValue );
    }
*/
    return pCubeMin;
}